

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void OpenHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  char *pcVar1;
  ostream *poVar2;
  mapped_type this;
  mapped_type *ppAVar3;
  long in_RCX;
  uint *in_RDX;
  undefined8 in_RSI;
  AnonADIOSFile *f;
  string strMode;
  _OpenResponseMsg open_response_msg;
  Remote_evpath_state *ev_state;
  OpenFileMsg open_msg;
  key_type *in_stack_fffffffffffffed8;
  unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
  *in_stack_fffffffffffffee0;
  allocator local_a9;
  string local_a8 [27];
  undefined1 in_stack_ffffffffffffff73;
  RemoteFileMode in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  AnonADIOSFile *in_stack_ffffffffffffff80;
  allocator local_69;
  string local_68 [32];
  ulong local_48;
  int64_t iStack_40;
  long local_38;
  uint *local_30;
  undefined8 local_10;
  
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Streaming",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (local_30[4] == 1) {
    std::__cxx11::string::operator=(local_68,"RandomAccess");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Got an open request (mode ");
  poVar2 = std::operator<<(poVar2,local_68);
  poVar2 = std::operator<<(poVar2,") for file ");
  poVar2 = std::operator<<(poVar2,*(char **)(local_30 + 2));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (mapped_type)operator_new(0x78);
  pcVar1 = *(char **)(local_30 + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,pcVar1,&local_a9);
  AnonADIOSFile::AnonADIOSFile
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             (bool)in_stack_ffffffffffffff73);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  iStack_40 = this->m_ID;
  local_48 = (ulong)*local_30;
  CMwrite(local_10,*(undefined8 *)(local_38 + 0x18),&local_48);
  CMconn_register_close_handler(local_10,ConnCloseHandler,0);
  ppAVar3 = std::
            unordered_map<unsigned_long,_AnonADIOSFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>_>
            ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *ppAVar3 = this;
  std::
  unordered_multimap<void*,unsigned_long,std::hash<void*>,std::equal_to<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
  ::emplace<_CMConnection*&,long&>
            ((unordered_multimap<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)this,(_CMConnection **)in_stack_fffffffffffffee0,(long *)in_stack_fffffffffffffed8);
  ADIOSFilesOpened = ADIOSFilesOpened + 1;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

static void OpenHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                        attr_list attrs)
{
    OpenFileMsg open_msg = static_cast<OpenFileMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _OpenResponseMsg open_response_msg;
    std::string strMode = "Streaming";
    if (open_msg->Mode == RemoteOpenRandomAccess)
        strMode = "RandomAccess";
    std::cout << "Got an open request (mode " << strMode << ") for file " << open_msg->FileName
              << std::endl;
    AnonADIOSFile *f =
        new AnonADIOSFile(open_msg->FileName, open_msg->Mode, open_msg->RowMajorOrder);
    memset(&open_response_msg, 0, sizeof(open_response_msg));
    open_response_msg.FileHandle = f->m_ID;
    open_response_msg.OpenResponseCondition = open_msg->OpenResponseCondition;
    CMwrite(conn, ev_state->OpenResponseFormat, &open_response_msg);
    CMconn_register_close_handler(conn, ConnCloseHandler, NULL);
    ADIOSFileMap[f->m_ID] = f;
    ConnToFileMap.emplace(conn, f->m_ID);
    ADIOSFilesOpened++;
    last_service_time = std::chrono::steady_clock::now();
}